

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracteventdispatcher.cpp
# Opt level: O0

QList<QAbstractEventDispatcher::TimerInfo> * __thiscall
QAbstractEventDispatcherV2::registeredTimers(QAbstractEventDispatcherV2 *this,QObject *object)

{
  iterator args;
  iterator o;
  nanoseconds interval;
  undefined8 in_RDX;
  long *in_RSI;
  QList<QAbstractEventDispatcher::TimerInfo> *in_RDI;
  long in_FS_OFFSET;
  TimerInfoV2 *t;
  QList<QAbstractEventDispatcher::TimerInfoV2> *__range1;
  QAbstractEventDispatcherV2 *self;
  QList<QAbstractEventDispatcher::TimerInfo> *result;
  iterator __end1;
  iterator __begin1;
  QList<QAbstractEventDispatcher::TimerInfoV2> timers;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined7 in_stack_ffffffffffffff30;
  iterator args_1;
  QList<QAbstractEventDispatcher::TimerInfo> *this_00;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar1;
  iterator local_30;
  QList<QAbstractEventDispatcher::TimerInfoV2> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d._0_4_ = 0xaaaaaaaa;
  local_28.d.d._4_4_ = 0xaaaaaaaa;
  local_28.d.ptr._0_4_ = 0xaaaaaaaa;
  local_28.d.ptr._4_4_ = 0xaaaaaaaa;
  this_00 = in_RDI;
  (**(code **)(*in_RSI + 0xd0))(&local_28,in_RSI,in_RDX);
  uVar1 = 0;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (TimerInfo *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QAbstractEventDispatcher::TimerInfo>::QList
            ((QList<QAbstractEventDispatcher::TimerInfo> *)0x3289fc);
  QList<QAbstractEventDispatcher::TimerInfoV2>::size(&local_28);
  QList<QAbstractEventDispatcher::TimerInfo>::reserve
            (this_00,CONCAT17(uVar1,in_stack_ffffffffffffff88));
  local_30.i = (TimerInfoV2 *)&DAT_aaaaaaaaaaaaaaaa;
  args = QList<QAbstractEventDispatcher::TimerInfoV2>::begin
                   ((QList<QAbstractEventDispatcher::TimerInfoV2> *)
                    CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  local_30 = args;
  o = QList<QAbstractEventDispatcher::TimerInfoV2>::end
                ((QList<QAbstractEventDispatcher::TimerInfoV2> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  args_1 = o;
  while (uVar1 = QList<QAbstractEventDispatcher::TimerInfoV2>::iterator::operator!=(&local_30,o),
        (bool)uVar1) {
    interval.__r = (rep)QList<QAbstractEventDispatcher::TimerInfoV2>::iterator::operator*(&local_30)
    ;
    qToUnderlying<Qt::TimerId>(((TimerInfoV2 *)interval.__r)->timerId);
    fromDuration<int>(interval);
    QList<QAbstractEventDispatcher::TimerInfo>::emplaceBack<int,int,Qt::TimerType_const&>
              (this_00,(int *)args.i,(int *)args_1.i,
               (TimerType *)CONCAT17(uVar1,in_stack_ffffffffffffff30));
    QList<QAbstractEventDispatcher::TimerInfoV2>::iterator::operator++(&local_30);
  }
  QList<QAbstractEventDispatcher::TimerInfoV2>::~QList
            ((QList<QAbstractEventDispatcher::TimerInfoV2> *)0x328bb7);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

auto QAbstractEventDispatcherV2::registeredTimers(QObject *object) const -> QList<TimerInfo>
{
    auto self = static_cast<const QAbstractEventDispatcherV2 *>(this);
    QList<TimerInfoV2> timers = self->timersForObject(object);
    QList<TimerInfo> result;
    result.reserve(timers.size());
    for (const TimerInfoV2 &t : timers)
        result.emplaceBack(qToUnderlying(t.timerId), fromDuration<int>(t.interval), t.timerType);
    return result;
}